

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcopy.c
# Opt level: O1

void dcopy_(integer *n,doublereal *dx,integer *incx,doublereal *dy,integer *incy)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  doublereal *pdVar6;
  doublereal *pdVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar1 = *n;
  if (0 < (int)uVar1) {
    iVar2 = *incx;
    if (((long)iVar2 == 1) && (*incy == 1)) {
      if (uVar1 % 7 == 0) {
        uVar8 = 1;
      }
      else {
        uVar9 = 0;
        do {
          dy[uVar9] = dx[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar1 % 7 != uVar9);
        if ((int)uVar1 < 7) {
          return;
        }
        uVar8 = uVar1 % 7 + 1;
      }
      uVar9 = (ulong)uVar8;
      do {
        dy[uVar9 - 1] = dx[uVar9 - 1];
        dy[uVar9] = dx[uVar9];
        dy[uVar9 + 1] = dx[uVar9 + 1];
        dy[uVar9 + 2] = dx[uVar9 + 2];
        dy[uVar9 + 3] = dx[uVar9 + 3];
        dy[uVar9 + 4] = dx[uVar9 + 4];
        dy[uVar9 + 5] = dx[uVar9 + 5];
        uVar9 = uVar9 + 7;
      } while (uVar9 <= uVar1);
    }
    else {
      iVar3 = *incy;
      iVar4 = iVar3 * (1 - uVar1) + 1;
      if (-1 < (long)iVar3) {
        iVar4 = 1;
      }
      iVar5 = (1 - uVar1) * iVar2 + 1;
      if (-1 < iVar2) {
        iVar5 = 1;
      }
      uVar8 = 1;
      if (1 < (int)uVar1) {
        uVar8 = uVar1;
      }
      pdVar6 = dx + (long)iVar5 + -1;
      pdVar7 = dy + (long)iVar4 + -1;
      do {
        *pdVar7 = *pdVar6;
        pdVar6 = pdVar6 + iVar2;
        pdVar7 = pdVar7 + iVar3;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return;
}

Assistant:

void dcopy_(integer *n, doublereal *dx, integer *incx, 
	doublereal *dy, integer *incy)
{


    /* System generated locals */

    /* Local variables */
    integer i, m, ix, iy, mp1;


/*     copies a vector, x, to a vector, y.   
       uses unrolled loops for increments equal to one.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DY(I) dy[(I)-1]
#define DX(I) dx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	DY(iy) = DX(ix);
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1   


          clean-up loop */

L20:
    m = *n % 7;
    if (m == 0) {
	goto L40;
    }
    for (i = 1; i <= m; ++i) {
	DY(i) = DX(i);
/* L30: */
    }
    if (*n < 7) {
	return;
    }
L40:
    mp1 = m + 1;
    for (i = mp1; i <= *n; i += 7) {
	DY(i) = DX(i);
	DY(i + 1) = DX(i + 1);
	DY(i + 2) = DX(i + 2);
	DY(i + 3) = DX(i + 3);
	DY(i + 4) = DX(i + 4);
	DY(i + 5) = DX(i + 5);
	DY(i + 6) = DX(i + 6);
/* L50: */
    }
    return;
}